

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

void findNotifyBits(int pi)

{
  callback_t *pcVar1;
  uint p2;
  
  p2 = 0;
  for (pcVar1 = gCallBackFirst; pcVar1 != (callback_t *)0x0; pcVar1 = pcVar1->next) {
    if (pcVar1->pi == pi) {
      p2 = p2 | 1 << ((byte)pcVar1->gpio & 0x1f);
    }
  }
  if (p2 == gNotifyBits[pi]) {
    return;
  }
  gNotifyBits[pi] = p2;
  pigpio_command(pi,0x13,gPigHandle[pi],p2,1);
  return;
}

Assistant:

static void findNotifyBits(int pi)
{
   callback_t *p;
   uint32_t bits = 0;

   p = gCallBackFirst;

   while (p)
   {
      if (p->pi == pi) bits |= (1<<(p->gpio));
      p = p->next;
   }

   if (bits != gNotifyBits[pi])
   {
      gNotifyBits[pi] = bits;
      pigpio_command(pi, PI_CMD_NB, gPigHandle[pi], gNotifyBits[pi], 1);
   }
}